

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.h
# Opt level: O1

void __thiscall
slang::ast::MinTypMaxExpression::visitExprs<slang::analysis::ClockVisitor::SeqExprVisitor&>
          (MinTypMaxExpression *this,SeqExprVisitor *visitor)

{
  Expression::
  visitExpression<slang::ast::Expression_const,slang::analysis::ClockVisitor::SeqExprVisitor&>
            (this->min_,this->min_,visitor);
  Expression::
  visitExpression<slang::ast::Expression_const,slang::analysis::ClockVisitor::SeqExprVisitor&>
            (this->typ_,this->typ_,visitor);
  Expression::
  visitExpression<slang::ast::Expression_const,slang::analysis::ClockVisitor::SeqExprVisitor&>
            (this->max_,this->max_,visitor);
  return;
}

Assistant:

decltype(auto) visitExprs(TVisitor&& visitor) const {
        min().visit(visitor);
        typ().visit(visitor);
        max().visit(visitor);
    }